

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<QMimeMagicRule>::moveAppend
          (QGenericArrayOps<QMimeMagicRule> *this,QMimeMagicRule *b,QMimeMagicRule *e)

{
  qsizetype *pqVar1;
  QMimeMagicRule *pQVar2;
  long lVar3;
  Data *pDVar4;
  QMimeMagicRule *pQVar5;
  qsizetype qVar6;
  Data *pDVar7;
  char *pcVar8;
  MatchFunction MVar9;
  int iVar10;
  quint32 qVar11;
  
  if ((b != e) && (b < e)) {
    pQVar2 = (this->super_QArrayDataPointer<QMimeMagicRule>).ptr;
    do {
      lVar3 = (this->super_QArrayDataPointer<QMimeMagicRule>).size;
      pDVar4 = (b->m_subMatches).d.d;
      (b->m_subMatches).d.d = (Data *)0x0;
      pQVar2[lVar3].m_subMatches.d.d = pDVar4;
      pQVar5 = (b->m_subMatches).d.ptr;
      (b->m_subMatches).d.ptr = (QMimeMagicRule *)0x0;
      pQVar2[lVar3].m_subMatches.d.ptr = pQVar5;
      qVar6 = (b->m_subMatches).d.size;
      (b->m_subMatches).d.size = 0;
      pQVar2[lVar3].m_subMatches.d.size = qVar6;
      pQVar2[lVar3].m_type = b->m_type;
      pDVar7 = (b->m_value).d.d;
      (b->m_value).d.d = (Data *)0x0;
      pQVar2[lVar3].m_value.d.d = pDVar7;
      pcVar8 = (b->m_value).d.ptr;
      (b->m_value).d.ptr = (char *)0x0;
      pQVar2[lVar3].m_value.d.ptr = pcVar8;
      qVar6 = (b->m_value).d.size;
      (b->m_value).d.size = 0;
      pQVar2[lVar3].m_value.d.size = qVar6;
      iVar10 = b->m_endPos;
      pQVar2[lVar3].m_startPos = b->m_startPos;
      pQVar2[lVar3].m_endPos = iVar10;
      pDVar7 = (b->m_mask).d.d;
      (b->m_mask).d.d = (Data *)0x0;
      pQVar2[lVar3].m_mask.d.d = pDVar7;
      pcVar8 = (b->m_mask).d.ptr;
      (b->m_mask).d.ptr = (char *)0x0;
      pQVar2[lVar3].m_mask.d.ptr = pcVar8;
      qVar6 = (b->m_mask).d.size;
      (b->m_mask).d.size = 0;
      pQVar2[lVar3].m_mask.d.size = qVar6;
      pDVar7 = (b->m_pattern).d.d;
      (b->m_pattern).d.d = (Data *)0x0;
      pQVar2[lVar3].m_pattern.d.d = pDVar7;
      pcVar8 = (b->m_pattern).d.ptr;
      (b->m_pattern).d.ptr = (char *)0x0;
      pQVar2[lVar3].m_pattern.d.ptr = pcVar8;
      qVar6 = (b->m_pattern).d.size;
      (b->m_pattern).d.size = 0;
      pQVar2[lVar3].m_pattern.d.size = qVar6;
      qVar11 = b->m_numberMask;
      MVar9 = b->m_matchFunction;
      pQVar5 = pQVar2 + lVar3;
      pQVar5->m_number = b->m_number;
      pQVar5->m_numberMask = qVar11;
      *(MatchFunction *)(&pQVar5->m_number + 2) = MVar9;
      *(undefined8 *)&pQVar2[lVar3].field_0x80 = *(undefined8 *)&b->field_0x80;
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<QMimeMagicRule>).size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }